

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O3

void __thiscall
soul::heart::Parser::parseReadStream
          (Parser *this,FunctionParseState *state,FunctionBuilder *builder,AssignmentTarget *target)

{
  Module *pMVar1;
  pointer ppVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  Identifier *in_R9;
  IODeclaration *this_00;
  pointer ppVar6;
  string_view other;
  Identifier name;
  CodeLocation local_98;
  FunctionParseState *local_88;
  FunctionParseState *local_80;
  undefined1 local_78 [16];
  CompileMessage local_68;
  
  local_78._8_8_ = parseGeneralIdentifier(this);
  pMVar1 = (this->module).object;
  if (pMVar1 == (Module *)0x0) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  local_88 = state;
  local_80 = (FunctionParseState *)target;
  if ((string *)local_78._8_8_ == (string *)0x0) {
    throwInternalCompilerError("isValid()","operator basic_string_view",0x22);
  }
  ppVar6 = (pMVar1->inputs).
           super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  ppVar2 = (pMVar1->inputs).
           super__Vector_base<soul::pool_ref<soul::heart::InputDeclaration>,_std::allocator<soul::pool_ref<soul::heart::InputDeclaration>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (ppVar6 != ppVar2) {
    pcVar3 = (((string *)local_78._8_8_)->_M_dataplus)._M_p;
    sVar4 = ((string *)local_78._8_8_)->_M_string_length;
    do {
      other._M_str = pcVar3;
      other._M_len = sVar4;
      bVar5 = Identifier::operator==(&(ppVar6->object->super_IODeclaration).name,other);
      if (bVar5) {
        this_00 = &ppVar6->object->super_IODeclaration;
        if (this_00 != (IODeclaration *)0x0) {
          bVar5 = false;
          goto LAB_00231055;
        }
        break;
      }
      ppVar6 = ppVar6 + 1;
    } while (ppVar6 != ppVar2);
  }
  CompileMessageHelpers::createMessage<soul::Identifier&>
            ((CompileMessage *)(local_78 + 0x10),(CompileMessageHelpers *)0x1,none,0x27dcfe,
             local_78 + 8,in_R9);
  (*(this->
    super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
    )._vptr_Tokeniser[2])(this,local_78 + 0x10);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_68.location.sourceCode.object);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.description._M_dataplus._M_p != &local_68.description.field_2) {
    operator_delete(local_68.description._M_dataplus._M_p,
                    (ulong)(local_68.description.field_2._0_8_ + 1));
  }
  bVar5 = true;
  this_00 = (IODeclaration *)0x0;
LAB_00231055:
  local_98.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_98.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_98.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_98.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_98.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  if (bVar5) {
    throwInternalCompilerError("object != nullptr","operator->",0x3c);
  }
  IODeclaration::getSingleDataType((Type *)(local_78 + 0x10),this_00);
  AssignmentTarget::create
            ((AssignmentTarget *)local_78,local_80,(FunctionBuilder *)local_88,(Type *)builder);
  if ((Expression *)local_78._0_8_ == (Expression *)0x0) {
    throwInternalCompilerError("object != nullptr","operator*",0x3b);
  }
  BlockBuilder::addReadStream
            (&builder->super_BlockBuilder,&local_98,(Expression *)local_78._0_8_,
             (InputDeclaration *)this_00);
  RefCountedPtr<soul::Structure>::decIfNotNull((Structure *)local_68.description.field_2._0_8_);
  RefCountedPtr<soul::SourceCodeText>::decIfNotNull(local_98.sourceCode.object);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2585e7);
  return;
}

Assistant:

void parseReadStream (FunctionParseState& state, FunctionBuilder& builder, const AssignmentTarget& target)
    {
        auto name = parseGeneralIdentifier();
        auto src = module->findInput (name);

        if (src == nullptr)
            throwError (Errors::cannotFindInput (name));

        builder.addReadStream (location, *target.create (state, builder, src->getSingleDataType()), *src);
        expectSemicolon();
    }